

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O0

bool __thiscall FpgaIO::PromSectorErase(FpgaIO *this,uint32_t addr,ProgressCallback cb)

{
  BasePort *pBVar1;
  bool bVar2;
  uint uVar3;
  uint32_t local_30;
  uint local_2c;
  uint32_t status;
  quadlet_t write_data;
  ProgressCallback cb_local;
  FpgaIO *pFStack_18;
  uint32_t addr_local;
  FpgaIO *this_local;
  
  _status = cb;
  cb_local._4_4_ = addr;
  pFStack_18 = this;
  PromWriteEnable(this,PROM_M25P16);
  local_2c = cb_local._4_4_ & 0xffffff | 0xd8000000;
  pBVar1 = (this->super_BoardIO).port;
  uVar3 = (*pBVar1->_vptr_BasePort[0x24])
                    (pBVar1,(ulong)(this->super_BoardIO).BoardId,8,(ulong)local_2c);
  if (((uVar3 & 1) != 0) && (bVar2 = PromGetStatus(this,&local_30,PROM_M25P16), bVar2)) {
    do {
      if (local_30 == 0) {
        return true;
      }
      if (_status == (ProgressCallback)0x0) {
        std::operator<<((ostream *)&std::cout,'.');
      }
      else {
        bVar2 = (*_status)((char *)0x0);
        if (!bVar2) {
          return false;
        }
      }
      bVar2 = PromGetStatus(this,&local_30,PROM_M25P16);
    } while (bVar2);
  }
  return false;
}

Assistant:

bool FpgaIO::PromSectorErase(uint32_t addr, const ProgressCallback cb)
{
    PromWriteEnable();
    quadlet_t write_data = 0xd8000000 | (addr&0x00ffffff);
    if (!port->WriteQuadlet(BoardId, 0x08, write_data))
        return false;
    // Wait for erase to finish
    uint32_t status;
    if (!PromGetStatus(status))
        return false;
    while (status) {
        PROGRESS_CALLBACK(cb, false);
        if (!PromGetStatus(status))
            return false;
    }
    return true;
}